

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O0

bool jsoncons::jsonschema::validate_ipv6_rfc2373(string *s)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ulong in_RDI;
  char c;
  size_t i;
  size_t dec_value;
  bool has_unspecified;
  size_t piece_count2;
  size_t piece_count;
  size_t digit_count;
  state_t state;
  bool local_7c;
  bool local_7b;
  bool local_7a;
  bool local_79;
  ulong local_48;
  ulong local_40;
  long local_30;
  ulong local_28;
  ulong local_20;
  int local_14;
  bool local_1;
  
  local_14 = 0;
  local_20 = 0;
  local_28 = 0;
  local_30 = 0;
  local_7b = false;
  local_40 = 0;
  local_48 = 0;
  do {
    uVar3 = std::__cxx11::string::length();
    if (uVar3 <= local_48) {
      if (local_14 == 2) {
        if (local_20 < 5) {
          local_79 = false;
          if (local_20 != 0) {
            local_7a = true;
            if (local_28 + 1 != 8) {
              local_7b = local_7b && local_28 + 1 < 9;
              local_7a = local_7b;
            }
            local_79 = local_7a;
          }
          local_1 = local_79;
        }
        else {
          local_1 = false;
        }
      }
      else if (local_14 == 3) {
        if (local_40 < 0x100) {
          local_7c = local_20 != 0 && local_30 == 3;
          local_1 = local_7c;
        }
        else {
          local_1 = false;
        }
      }
      else if (local_14 == 5) {
        local_1 = local_28 < 9;
      }
      else {
        local_1 = false;
      }
      return local_1;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI);
    cVar1 = *pcVar4;
    switch(local_14) {
    case 0:
      iVar2 = (int)cVar1;
      if (9 < iVar2 - 0x30U) {
        if (iVar2 == 0x3a) {
          if (local_7b) {
            return false;
          }
          local_14 = 4;
          break;
        }
        if ((5 < iVar2 - 0x41U) && (5 < iVar2 - 0x61U)) {
          return false;
        }
      }
      local_14 = 2;
      local_20 = local_20 + 1;
      local_28 = 0;
      break;
    case 1:
      iVar2 = (int)cVar1;
      if (iVar2 - 0x30U < 10) {
        local_40 = local_40 * 10 + (long)(cVar1 + -0x30);
        local_14 = 2;
        local_20 = local_20 + 1;
      }
      else if (iVar2 == 0x3a) {
        if (local_7b) {
          return false;
        }
        local_7b = true;
        local_14 = 5;
      }
      else {
        if ((5 < iVar2 - 0x41U) && (5 < iVar2 - 0x61U)) {
          return false;
        }
        local_14 = 2;
        local_20 = local_20 + 1;
      }
      break;
    case 2:
      iVar2 = (int)cVar1;
      if (iVar2 == 0x2e) {
        if ((local_28 != 6) && (!local_7b)) {
          return false;
        }
        local_30 = local_30 + 1;
        local_14 = 3;
        local_40 = 0;
      }
      else {
        if (9 < iVar2 - 0x30U) {
          if (iVar2 == 0x3a) {
            if (4 < local_20) {
              return false;
            }
            local_28 = local_28 + 1;
            local_20 = 0;
            local_40 = 0;
            local_14 = 1;
            break;
          }
          if ((5 < iVar2 - 0x41U) && (5 < iVar2 - 0x61U)) {
            return false;
          }
        }
        local_20 = local_20 + 1;
      }
      break;
    case 3:
      if (cVar1 == 0x2e) {
        if (0xff < local_40) {
          return false;
        }
        local_20 = 0;
        local_40 = 0;
        local_30 = local_30 + 1;
      }
      else {
        if (9 < (int)cVar1 - 0x30U) {
          return false;
        }
        local_40 = local_40 * 10 + (long)(cVar1 + -0x30);
        local_20 = local_20 + 1;
      }
      break;
    case 4:
      if (cVar1 != ':') {
        return false;
      }
      local_7b = true;
      local_14 = 5;
      break;
    case 5:
      iVar2 = (int)cVar1;
      if (((9 < iVar2 - 0x30U) && (5 < iVar2 - 0x41U)) && (5 < iVar2 - 0x61U)) {
        return false;
      }
      local_14 = 2;
      local_20 = local_20 + 1;
      break;
    default:
      return false;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

inline
    bool validate_ipv6_rfc2373(const std::string& s)
    {
        enum class state_t{start,expect_hexdig_or_unspecified,
                              hexdig, decdig,expect_unspecified, unspecified};

        state_t state = state_t::start;

        std::size_t digit_count = 0;
        std::size_t piece_count = 0;
        std::size_t piece_count2 = 0;
        bool has_unspecified = false;
        std::size_t dec_value = 0;

        for (std::size_t i = 0; i < s.length(); ++i)
        {
            const char c = s[i];
            switch (state)
            {
                case state_t::start:
                {
                    switch (c)
                    {
                        case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                        case 'A':case 'B':case 'C':case 'D':case 'E':case 'F':
                        case 'a':case 'b':case 'c':case 'd':case 'e':case 'f':
                            state = state_t::hexdig;
                            ++digit_count;
                            piece_count = 0;
                            break;
                        case ':':
                            if (!has_unspecified)
                            {
                                state = state_t::expect_unspecified;
                            }
                            else
                            {
                                return false;
                            }
                            break;
                        default:
                            return false;
                    }
                    break;
                }
                case state_t::expect_hexdig_or_unspecified:
                {
                    switch (c)
                    {
                        case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                            dec_value = dec_value*10 + static_cast<std::size_t>(c - '0'); // just in case this piece is followed by a dot
                            state = state_t::hexdig;
                            ++digit_count;
                            break;
                        case 'A':case 'B':case 'C':case 'D':case 'E':case 'F':
                        case 'a':case 'b':case 'c':case 'd':case 'e':case 'f':
                            state = state_t::hexdig;
                            ++digit_count;
                            break;
                        case ':':
                            if (!has_unspecified)
                            {
                                has_unspecified = true;
                                state = state_t::unspecified;
                            }
                            else
                            {
                                return false;
                            }
                            break;
                        default:
                            return false;
                    }
                    break;
                }
                case state_t::expect_unspecified:
                {
                    if (c == ':')
                    {
                        has_unspecified = true;
                        state = state_t::unspecified;
                    }
                    else
                    {
                        return false;
                    }
                    break;
                }
                case state_t::hexdig:
                {
                    switch (c)
                    {
                        case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                        case 'A':case 'B':case 'C':case 'D':case 'E':case 'F':
                        case 'a':case 'b':case 'c':case 'd':case 'e':case 'f':
                            ++digit_count;
                            break;
                        case ':':
                            if (digit_count <= 4)
                            {
                                ++piece_count;
                                digit_count = 0;
                                dec_value = 0;
                                state = state_t::expect_hexdig_or_unspecified;
                            }
                            else
                            {
                                return false;
                            }
                            break;
                        case '.':
                            if (piece_count == 6 || has_unspecified)
                            {
                                ++piece_count2;
                                state = state_t::decdig;
                                dec_value = 0;
                            }
                            else
                            {
                                return false;
                            }
                            break;
                        default:
                            return false;
                    }
                    break;
                }
                case state_t::decdig:
                {
                    switch (c)
                    {
                        case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                            dec_value = dec_value*10 + static_cast<std::size_t>(c - '0');
                            ++digit_count;
                            break;
                        case '.':
                            if (dec_value > 0xff)
                            {
                                return false;
                            }
                            digit_count = 0;
                            dec_value = 0;
                            ++piece_count2;
                            break;
                        default:
                            return false;
                    }
                    break;
                }
                case state_t::unspecified:
                {
                    switch (c)
                    {
                        case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                        case 'A':case 'B':case 'C':case 'D':case 'E':case 'F':
                        case 'a':case 'b':case 'c':case 'd':case 'e':case 'f':
                            state = state_t::hexdig;
                            ++digit_count;
                            break;
                        default:
                            return false;
                    }
                    break;
                }
                default:
                    return false;
            }
        }

        switch (state)
        {
            case state_t::unspecified:
                return piece_count <= 8;
            case state_t::hexdig:
                if (digit_count <= 4)
                {
                    ++piece_count;
                    return digit_count > 0 && (piece_count == 8 || (has_unspecified && piece_count <= 8));
                }
                else
                {
                    return false;
                }
            case state_t::decdig:
                ++piece_count2;
                if (dec_value > 0xff)
                {
                    return false;
                }
                return digit_count > 0 && piece_count2 == 4;
            default:
                return false;
        }
    }